

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_bigfloat(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
             ,string_type *str,error_code *ec)

{
  stream_source<unsigned_char> *this_00;
  pointer puVar1;
  uint8_t *puVar2;
  byte bVar3;
  uint64_t uVar4;
  ssize_t sVar5;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  ulong extraout_RAX;
  size_t in_RCX;
  cbor_errc __e;
  char cVar6;
  uint8_t b;
  bigint n;
  byte local_a9;
  basic_bigint<std::allocator<unsigned_char>_> local_a8;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  uVar4 = get_uint64_value(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (uVar4 == 2) {
    this_00 = &this->source_;
    if (((this->source_).buffer_length_ != 0) ||
       (stream_source<unsigned_char>::fill_buffer(this_00), (this->source_).buffer_length_ != 0)) {
      bVar3 = *(this->source_).buffer_data_ >> 5;
      if (bVar3 == 0) {
        get_uint64_value(this,ec);
      }
      else {
        if (bVar3 != 1) goto LAB_0026343e;
        get_int64_value(this,ec);
      }
      if (ec->_M_value != 0) {
        return;
      }
      if (((this->source_).buffer_length_ != 0) ||
         (stream_source<unsigned_char>::fill_buffer(this_00), (this->source_).buffer_length_ != 0))
      {
        bVar3 = *(this->source_).buffer_data_ >> 5;
        if (bVar3 == 0) {
          get_uint64_value(this,ec);
          if (ec->_M_value != 0) {
            return;
          }
          basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
          read_bigfloat();
          goto LAB_0026347f;
        }
        if (bVar3 != 6) {
          if (bVar3 == 1) {
            basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
            read_bigfloat();
            if ((extraout_RAX & 1) != 0) {
              return;
            }
            goto LAB_0026347f;
          }
          goto LAB_0026343e;
        }
        sVar5 = stream_source<unsigned_char>::read(this_00,(int)&local_a9,(void *)0x1,in_RCX);
        if ((sVar5 != 0) &&
           (((this->source_).buffer_length_ != 0 ||
            (stream_source<unsigned_char>::fill_buffer(this_00), (this->source_).buffer_length_ != 0
            )))) {
          if ((*(this->source_).buffer_data_ & 0xe0) != 0x40) {
LAB_0026347f:
            basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
            read_bigfloat();
            return;
          }
          puVar1 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar1) {
            (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar1;
          }
          read_byte_string(this,&this->bytes_buffer_,ec);
          if (ec->_M_value == 0) {
            cVar6 = (char)str;
            if ((local_a9 & 0x1f) == 3) {
              std::__cxx11::string::push_back(cVar6);
              std::__cxx11::string::push_back(cVar6);
              puVar2 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        (&local_a8,1,puVar2,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
              local_58.field_0._0_1_ = local_58.field_0._0_1_ & 0xfc | 2;
              local_58.field_0.common_stor_.length_ = 1;
              local_58.field_0.short_stor_.values_[0] = 1;
              local_58.field_0.short_stor_.values_[1] = 0;
              n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_58,&local_a8);
              basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_80,n_00);
              basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a8,&local_80);
              if (((local_80.field_0._0_1_ & 1) != 0) &&
                 ((pointer)local_80.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                operator_delete(local_80.field_0.dynamic_stor_.data_,
                                local_80.field_0.short_stor_.values_[0] << 3);
              }
              if (((local_58.field_0._0_1_ & 1) != 0) &&
                 ((pointer)local_58.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                operator_delete(local_58.field_0.dynamic_stor_.data_,
                                local_58.field_0.short_stor_.values_[0] << 3);
              }
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,str);
              basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
              read_bigfloat();
            }
            else if ((local_a9 & 0x1f) == 2) {
              std::__cxx11::string::push_back(cVar6);
              std::__cxx11::string::push_back(cVar6);
              puVar2 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        (&local_a8,1,puVar2,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&local_a8,str);
              basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
              read_bigfloat((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
                             *)&local_a8);
            }
            goto LAB_0026347f;
          }
          goto LAB_0026344b;
        }
      }
    }
    __e = unexpected_eof;
  }
  else {
LAB_0026343e:
    __e = invalid_bigfloat;
  }
  std::error_code::operator=(ec,__e);
LAB_0026344b:
  this->more_ = false;
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }